

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

int closeHandleInOpenList(FileHandle **list,FileHandle *handle)

{
  PHYSFS_Io *pPVar1;
  PHYSFS_uint8 *pPVar2;
  int iVar3;
  PHYSFS_uint8 *tmp;
  PHYSFS_Io *io;
  FileHandle *i;
  FileHandle *prev;
  FileHandle *handle_local;
  FileHandle **list_local;
  
  i = (FileHandle *)0x0;
  io = (PHYSFS_Io *)*list;
  while( true ) {
    if (io == (PHYSFS_Io *)0x0) {
      return 0;
    }
    if (io == (PHYSFS_Io *)handle) break;
    i = (FileHandle *)io;
    io = (PHYSFS_Io *)io->duplicate;
  }
  pPVar1 = handle->io;
  pPVar2 = handle->buffer;
  if (handle->forReading == '\0') {
    iVar3 = PHYSFS_flush((PHYSFS_File *)handle);
    if (iVar3 == 0) {
      return -1;
    }
    if ((pPVar1->flush != (_func_int_PHYSFS_Io_ptr *)0x0) &&
       (iVar3 = (*pPVar1->flush)(pPVar1), iVar3 == 0)) {
      return -1;
    }
  }
  (*pPVar1->destroy)(pPVar1);
  if (pPVar2 != (PHYSFS_uint8 *)0x0) {
    (*__PHYSFS_AllocatorHooks.Free)(pPVar2);
  }
  if (i == (FileHandle *)0x0) {
    *list = handle->next;
  }
  else {
    i->next = handle->next;
  }
  (*__PHYSFS_AllocatorHooks.Free)(handle);
  return 1;
}

Assistant:

static int closeHandleInOpenList(FileHandle **list, FileHandle *handle)
{
    FileHandle *prev = NULL;
    FileHandle *i;

    for (i = *list; i != NULL; i = i->next)
    {
        if (i == handle)  /* handle is in this list? */
        {
            PHYSFS_Io *io = handle->io;
            PHYSFS_uint8 *tmp = handle->buffer;

            /* send our buffer to io... */
            if (!handle->forReading)
            {
                if (!PHYSFS_flush((PHYSFS_File *) handle))
                    return -1;

                /* ...then have io send it to the disk... */
                else if (io->flush && !io->flush(io))
                    return -1;
            } /* if */

            /* ...then close the underlying file. */
            io->destroy(io);

            if (tmp != NULL)  /* free any associated buffer. */
                allocator.Free(tmp);

            if (prev == NULL)
                *list = handle->next;
            else
                prev->next = handle->next;

            allocator.Free(handle);
            return 1;
        } /* if */
        prev = i;
    } /* for */

    return 0;
}